

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O0

char * ar_basename(char *path)

{
  size_t sVar1;
  bool bVar2;
  char *local_28;
  char *startp;
  char *endp;
  char *path_local;
  
  sVar1 = strlen(path);
  local_28 = path + (sVar1 - 1);
  if (*local_28 == '/') {
    path_local = (char *)0x0;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (path < local_28) {
        bVar2 = local_28[-1] != '/';
      }
      if (!bVar2) break;
      local_28 = local_28 + -1;
    }
    path_local = local_28;
  }
  return path_local;
}

Assistant:

static const char *
ar_basename(const char *path)
{
	const char *endp, *startp;

	endp = path + strlen(path) - 1;
	/*
	 * For filename with trailing slash(es), we return
	 * NULL indicating an error.
	 */
	if (*endp == '/')
		return (NULL);

	/* Find the start of the base */
	startp = endp;
	while (startp > path && *(startp - 1) != '/')
		startp--;
	
	return (startp);
}